

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

Var __thiscall Js::InterpreterStackFrame::ProcessLinkFailedAsmJsModule(InterpreterStackFrame *this)

{
  ulong uVar1;
  byte bVar2;
  ImplicitCallFlags flags;
  Utf8SourceInfo *pUVar3;
  ThreadContext *this_00;
  ScriptContext *this_01;
  byte *pbVar4;
  undefined1 this_02 [8];
  bool profileParams;
  ScriptFunction *pSVar5;
  ExecutionMode EVar6;
  bool bVar7;
  void *pvVar8;
  FunctionBody *pFVar9;
  undefined7 extraout_var;
  Var pvVar10;
  undefined8 in_RCX;
  ByteCodeReader *pBVar11;
  ulong uVar12;
  ByteCodeReader *pBVar13;
  Var *stackAllocation;
  PVOID unaff_retaddr;
  undefined1 auStack_b8 [16];
  Setup setup;
  PushPopFrameHelper pushPopFrameHelper;
  DynamicProfileInfo *local_50;
  undefined1 local_48 [8];
  Var *allocation;
  ScriptFunction *local_38;
  ScriptFunction *funcObj;
  
  pBVar11 = (ByteCodeReader *)auStack_b8;
  AsmJSCompiler::OutputError(*(ScriptContext **)(this + 0x78),L"asm.js linking failed.");
  pvVar8 = FunctionProxy::GetAuxPtr(*(FunctionProxy **)(this + 0x88),AsmJsModuleInfo);
  if (*(char *)((long)pvVar8 + 0xac) == '\x01') {
    Throw::OutOfMemory();
  }
  local_38 = *(ScriptFunction **)(this + 0x80);
  JavascriptFunction::ReparseAsmJsModule(&local_38);
  pFVar9 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)local_38);
  EVar6 = FunctionBody::GetInterpreterExecutionMode(pFVar9,false);
  allocation._4_4_ = (undefined4)CONCAT71((int7)((ulong)in_RCX >> 8),1);
  if (EVar6 != ProfilingInterpreter) {
    pFVar9 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)local_38);
    pUVar3 = (pFVar9->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
    if ((((pUVar3->debugModeSource).ptr == (uchar *)0x0) && ((pUVar3->field_0xa8 & 0x20) == 0)) ||
       ((pUVar3->field_0xa8 & 0x40) == 0)) {
      allocation._4_4_ = 0;
    }
    else {
      pFVar9 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)local_38);
      bVar7 = DynamicProfileInfo::IsEnabled(pFVar9);
      allocation._4_4_ = (undefined4)CONCAT71(extraout_var,bVar7);
    }
  }
  if ((char)allocation._4_4_ == '\0') {
    local_50 = (DynamicProfileInfo *)0x0;
  }
  else {
    pFVar9 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)local_38);
    local_50 = FunctionBody::GetDynamicProfileInfo(pFVar9);
    ThreadContext::ClearImplicitCallFlags
              (((((((local_38->super_ScriptFunctionBase).super_JavascriptFunction.
                    super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                super_JavascriptLibraryBase).scriptContext.ptr)->threadContext);
  }
  Setup::Setup((Setup *)(auStack_b8 + 8),local_38,*(Var **)(this + 0x20),*(int *)(this + 0x18));
  uVar12 = (ulong)setup.localCount;
  local_48 = (undefined1  [8])0x0;
  uVar1 = uVar12 + (uint)setup.inSlotsCount;
  if (uVar1 < 0x8001) {
    ThreadContext::ProbeStack
              ((*(ScriptContext **)(this + 0x78))->threadContext,uVar1 * 8 + 0x4000,
               *(ScriptContext **)(this + 0x78),unaff_retaddr);
    pBVar11 = (ByteCodeReader *)(auStack_b8 + -(uVar1 * 8 + 0xf & 0xfffffffffffffff0));
    bVar7 = false;
    stackAllocation = (Var *)0x0;
    pBVar13 = pBVar11;
    local_48 = (undefined1  [8])pBVar11;
  }
  else {
    setup.bailedOut = false;
    setup.bailedOutOfInlinee = false;
    setup.isGeneratorFrame = false;
    setup._59_5_ = 0;
    bVar7 = ScriptContext::EnsureInterpreterArena
                      (*(ScriptContext **)(this + 0x78),(ArenaAllocator **)&setup.bailedOut);
    local_48 = (undefined1  [8])
               Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               AllocInternal((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                             setup._56_8_,(ulong)(uint)setup.inSlotsCount << 3);
    if (uVar12 == 0) {
      stackAllocation = (Var *)0x0;
    }
    else {
      ThreadContext::ProbeStack
                ((*(ScriptContext **)(this + 0x78))->threadContext,uVar12 * 8 + 0x4000,
                 *(ScriptContext **)(this + 0x78),unaff_retaddr);
      pBVar11 = (ByteCodeReader *)(auStack_b8 + -(uVar12 * 8 + 0xf & 0xfffffffffffffff0));
      stackAllocation = (Var *)pBVar11;
    }
    pBVar13 = (ByteCodeReader *)local_48;
  }
  pBVar11[-1].m_currentLocation = (byte *)0xfefefefefefefefe;
  pBVar11[-1].m_endLocation = (byte *)0xfefefefefefefefe;
  pSVar5 = local_38;
  this_02 = local_48;
  pBVar11[-1].m_startLocation = (byte *)0x99b532;
  pFVar9 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)pSVar5);
  bVar2 = (pFVar9->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47;
  profileParams = (bool)allocation._4_1_;
  pBVar11[-1].m_startLocation = (byte *)&pBVar11[-1].m_currentLocation;
  pBVar11[-2].m_endLocation = (byte *)pBVar13;
  pBVar11[-2].m_currentLocation = (byte *)0x99b55b;
  Setup::InitializeAllocation
            ((Setup *)(auStack_b8 + 8),(Var *)this_02,stackAllocation,(bool)((bVar2 & 4) >> 2),
             profileParams,(LoopHeader *)0x0,(DWORD_PTR)pBVar11[-2].m_endLocation,
             pBVar11[-1].m_startLocation);
  pSVar5 = local_38;
  pBVar11[-1].m_startLocation = (byte *)0x99b568;
  pFVar9 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)pSVar5);
  pBVar11[-1].m_startLocation = (byte *)0x99b575;
  ByteCodeReader::Create((ByteCodeReader *)this_02,pFVar9,0);
  pSVar5 = local_38;
  pBVar11[-1].m_startLocation = (byte *)0x99b57e;
  pFVar9 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)pSVar5);
  pBVar11[-1].m_startLocation = (byte *)0x99b586;
  FunctionBody::BeginExecution(pFVar9);
  pbVar4 = *(byte **)(this + 0xa0);
  this_00 = *(ThreadContext **)(((ByteCodeReader *)((long)this_02 + 0x78))->m_startLocation + 0x3b8)
  ;
  ((ByteCodeReader *)((long)this_02 + 0x90))->m_currentLocation = *(byte **)(this + 0x98);
  ((ByteCodeReader *)((long)this_02 + 0x90))->m_endLocation = pbVar4;
  setup._56_8_ = this_00;
  if ((((ByteCodeReader *)((long)this_02 + 0x78))->m_endLocation[0x46] & 2) == 0) {
    pBVar11[-1].m_startLocation = (byte *)0x99b5c1;
    ThreadContext::PushInterpreterFrame(this_00,(InterpreterStackFrame *)this_02);
  }
  pBVar11[-1].m_startLocation = (byte *)0x99b5cf;
  pvVar10 = ProcessUnprofiled((InterpreterStackFrame *)this_02);
  if (allocation._4_1_ != '\0') {
    flags = *(ImplicitCallFlags *)(*(long *)(*(long *)(this + 0x78) + 0x3b8) + 0x1570);
    pBVar11[-1].m_startLocation = (byte *)0x99b5f3;
    DynamicProfileInfo::RecordImplicitCallFlags(local_50,flags);
  }
  if (bVar7 != false) {
    this_01 = *(ScriptContext **)(this + 0x78);
    pBVar11[-1].m_startLocation = (byte *)0x99b602;
    ScriptContext::ReleaseInterpreterArena(this_01);
  }
  pBVar11[-1].m_startLocation = (byte *)0x99b60b;
  PushPopFrameHelper::~PushPopFrameHelper((PushPopFrameHelper *)&setup.bailedOut);
  return pvVar10;
}

Assistant:

Var InterpreterStackFrame::ProcessLinkFailedAsmJsModule()
    {
        AsmJSCompiler::OutputError(this->scriptContext, _u("asm.js linking failed."));

        Js::FunctionBody* asmJsModuleFunctionBody = GetFunctionBody();
        AsmJsModuleInfo* info = asmJsModuleFunctionBody->GetAsmJsModuleInfo();

        // do not support relinking with failed relink
        if (info->IsRuntimeProcessed())
        {
            Js::Throw::OutOfMemory();
        }

        ScriptFunction * funcObj = GetJavascriptFunction();
        ScriptFunction::ReparseAsmJsModule(&funcObj);
        const bool doProfile =
            funcObj->GetFunctionBody()->GetInterpreterExecutionMode(false) == ExecutionMode::ProfilingInterpreter ||
            (funcObj->GetFunctionBody()->IsInDebugMode() && DynamicProfileInfo::IsEnabled(funcObj->GetFunctionBody()));

        DynamicProfileInfo * dynamicProfileInfo = nullptr;
        if (doProfile)
        {
            dynamicProfileInfo = funcObj->GetFunctionBody()->GetDynamicProfileInfo();
            funcObj->GetScriptContext()->GetThreadContext()->ClearImplicitCallFlags();
        }

        // after reparsing, we want to also use a new interpreter stack frame, as it will have different characteristics than the asm.js version
        InterpreterStackFrame::Setup setup(funcObj, m_inParams, m_inSlotsCount);
        size_t varAllocCount = setup.GetAllocationVarCount();
        size_t stackVarAllocCount = setup.GetStackAllocationVarCount();
        size_t varSizeInBytes;

        Var* allocation = nullptr;
        Var* stackAllocation = nullptr;
        DWORD_PTR stackAddr;
        bool fReleaseAlloc = false;
        if ((varAllocCount + stackVarAllocCount) > InterpreterStackFrame::LocalsThreshold)
        {
            ArenaAllocator *tmpAlloc = nullptr;
            fReleaseAlloc = GetScriptContext()->EnsureInterpreterArena(&tmpAlloc);
            varSizeInBytes = varAllocCount * sizeof(Var);
            allocation = (Var*)tmpAlloc->Alloc(varSizeInBytes);
            if (stackVarAllocCount != 0)
            {
                size_t stackVarSizeInBytes = stackVarAllocCount * sizeof(Var);
                PROBE_STACK_PARTIAL_INITIALIZED_INTERPRETER_FRAME(GetScriptContext(), Js::Constants::MinStackInterpreter + stackVarSizeInBytes);
                stackAllocation = (Var*)_alloca(stackVarSizeInBytes);
            }
            // use a stack address so the debugger stepping logic works (step-out, for example, compares stack depths to determine when to complete the step)
            // debugger stepping does not matter here, but it's worth being consistent with normal stack frame
            stackAddr = reinterpret_cast<DWORD_PTR>(&allocation);
        }
        else
        {
            varSizeInBytes = (varAllocCount + stackVarAllocCount) * sizeof(Var);
            PROBE_STACK_PARTIAL_INITIALIZED_INTERPRETER_FRAME(GetScriptContext(), Js::Constants::MinStackInterpreter + varSizeInBytes);
            allocation = (Var*)_alloca(varSizeInBytes);
            stackAddr = reinterpret_cast<DWORD_PTR>(allocation);
        }

#if DBG
        Var invalidStackVar = (Js::RecyclableObject*)_alloca(sizeof(Js::RecyclableObject));
        memset(invalidStackVar, 0xFE, sizeof(Js::RecyclableObject));
#endif

        InterpreterStackFrame * newInstance = setup.InitializeAllocation(allocation, stackAllocation, funcObj->GetFunctionBody()->GetHasImplicitArgIns(), doProfile, nullptr, stackAddr
#if DBG
            , invalidStackVar
#endif
            );

        newInstance->m_reader.Create(funcObj->GetFunctionBody());
        // now that we have set up the new frame, let's interpret it!
        funcObj->GetFunctionBody()->BeginExecution();

        PushPopFrameHelper pushPopFrameHelper(newInstance, this->returnAddress, this->addressOfReturnAddress);
        Var retVal = newInstance->ProcessUnprofiled();

        if (doProfile)
        {
            dynamicProfileInfo->RecordImplicitCallFlags(GetScriptContext()->GetThreadContext()->GetImplicitCallFlags());
        }

        if (fReleaseAlloc)
        {
            GetScriptContext()->ReleaseInterpreterArena();
        }

        return retVal;
    }